

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int wait_ms(int timeout_ms)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint *puVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  timeval tVar8;
  timeval tVar9;
  
  if (timeout_ms != 0) {
    if (timeout_ms < 0) {
      piVar6 = __errno_location();
      *piVar6 = 0x16;
      iVar7 = -1;
    }
    else {
      tVar8 = tvnow();
      iVar7 = timeout_ms;
      do {
        bVar1 = false;
        iVar3 = poll((pollfd *)0x0,0,iVar7);
        if (iVar3 == -1) {
          puVar4 = (uint *)__errno_location();
          if ((*puVar4 & 0xfffffffb) == 0) {
            tVar9 = tvnow();
            lVar5 = tVar9.tv_sec - tVar8.tv_sec;
            iVar7 = 1;
            if ((lVar5 < 0x20c49ba5e353f7) && (iVar7 = 0, -0x20c49ba5e353f7 < lVar5)) {
              auVar2 = SEXT816(tVar9.tv_usec - tVar8.tv_usec) * SEXT816(-0x20c49ba5e353f7cf);
              iVar7 = ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) + (int)lVar5 * -1000;
            }
            iVar7 = iVar7 + timeout_ms;
            bVar1 = 0 < iVar7;
          }
          else {
            bVar1 = false;
          }
        }
      } while ((iVar3 == -1) && (bVar1));
      iVar7 = -(uint)(iVar3 != 0);
    }
    return iVar7;
  }
  return 0;
}

Assistant:

int wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct timeval initial_tv;
  int pending_ms;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    errno = EINVAL;
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = tvnow();
  do {
    int error;
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = errno;
    if(error && (error != EINTR))
      break;
    pending_ms = timeout_ms - (int)timediff(tvnow(), initial_tv);
    if(pending_ms <= 0)
      break;
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}